

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLDriver.cpp
# Opt level: O0

void __thiscall
irr::video::COpenGLDriver::getColorBuffer
          (COpenGLDriver *this,void *vertices,u32 vertexCount,E_VERTEX_TYPE vType)

{
  uint uVar1;
  array<unsigned_char> *this_00;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  S3DVertexTangents *p_2;
  S3DVertex2TCoords *p_1;
  S3DVertex *p;
  u32 i;
  undefined4 in_stack_ffffffffffffff98;
  u32 in_stack_ffffffffffffff9c;
  array<unsigned_char> *in_stack_ffffffffffffffa0;
  undefined8 local_38;
  undefined4 local_1c;
  
  uVar1 = in_EDX << 2;
  core::array<unsigned_char>::set_used(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  if (in_ECX == 0) {
    for (local_1c = 0; local_1c < uVar1; local_1c = local_1c + 4) {
      core::array<unsigned_char>::operator[](in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
      SColor::toOpenGLColor
                ((SColor *)in_stack_ffffffffffffffa0,
                 (u8 *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    }
  }
  else if (in_ECX == 1) {
    for (local_1c = 0; local_1c < uVar1; local_1c = local_1c + 4) {
      core::array<unsigned_char>::operator[](in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
      SColor::toOpenGLColor
                ((SColor *)in_stack_ffffffffffffffa0,
                 (u8 *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    }
  }
  else if (in_ECX == 2) {
    local_38 = in_RSI;
    for (local_1c = 0; local_1c < uVar1; local_1c = local_1c + 4) {
      this_00 = (array<unsigned_char> *)(local_38 + 0x18);
      core::array<unsigned_char>::operator[](this_00,in_stack_ffffffffffffff9c);
      SColor::toOpenGLColor
                ((SColor *)this_00,
                 (u8 *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      local_38 = local_38 + 0x3c;
    }
  }
  return;
}

Assistant:

void COpenGLDriver::getColorBuffer(const void *vertices, u32 vertexCount, E_VERTEX_TYPE vType)
{
	// convert colors to gl color format.
	vertexCount *= 4; // reused as color component count
	ColorBuffer.set_used(vertexCount);
	u32 i;

	switch (vType) {
	case EVT_STANDARD: {
		const S3DVertex *p = static_cast<const S3DVertex *>(vertices);
		for (i = 0; i < vertexCount; i += 4) {
			p->Color.toOpenGLColor(&ColorBuffer[i]);
			++p;
		}
	} break;
	case EVT_2TCOORDS: {
		const S3DVertex2TCoords *p = static_cast<const S3DVertex2TCoords *>(vertices);
		for (i = 0; i < vertexCount; i += 4) {
			p->Color.toOpenGLColor(&ColorBuffer[i]);
			++p;
		}
	} break;
	case EVT_TANGENTS: {
		const S3DVertexTangents *p = static_cast<const S3DVertexTangents *>(vertices);
		for (i = 0; i < vertexCount; i += 4) {
			p->Color.toOpenGLColor(&ColorBuffer[i]);
			++p;
		}
	} break;
	}
}